

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

Ptr express(TokenReader *tokens)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  SimpleASTNode *pSVar1;
  element_type *peVar2;
  invalid_argument *piVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  SimpleASTNode *__tmp;
  bool bVar5;
  bool bVar6;
  Ptr PVar7;
  Ptr local_110;
  Ptr local_100;
  Ptr local_f0;
  int local_e0;
  Token token;
  int local_a0;
  undefined4 uStack_9c;
  Ptr child2;
  undefined1 local_88 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_70;
  ASTNodeType local_5c;
  SimpleASTNode *pSStack_58;
  Ptr child1_1;
  SimpleASTNode *pSStack_40;
  Ptr child1;
  
  andExpress((TokenReader *)&pSStack_58);
  pSStack_40 = pSStack_58;
  child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_text)._M_dataplus._M_p =
           *(int *)&((child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->m_text)._M_dataplus._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&((child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_text)._M_dataplus._M_p =
           *(int *)&((child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->m_text)._M_dataplus._M_p + 1;
    }
  }
  do {
    TokenReader::peek();
    bVar5 = pSStack_40 == (SimpleASTNode *)0x0;
    bVar6 = local_e0 != 10;
    if (!bVar6 && !bVar5) {
      TokenReader::read();
      local_e0 = local_a0;
      std::__cxx11::string::operator=((string *)&token,(string *)&child2);
      if (child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_88) {
        operator_delete(child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
      andExpress((TokenReader *)&local_a0);
      local_5c = 6;
      local_88._16_8_ = (SimpleASTNode *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SimpleASTNode,std::allocator<SimpleASTNode>,ASTNodeType_const&,std::__cxx11::string_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18),
                 (SimpleASTNode **)(local_88 + 0x10),
                 (allocator<SimpleASTNode> *)
                 ((long)&child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7),(ASTNodeType *)(local_88 + 0x2c),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token);
      peVar2 = child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)aStack_70._M_allocated_capacity;
      pSStack_40 = (SimpleASTNode *)local_88._16_8_;
      local_88._16_8_ = 0;
      aStack_70._M_allocated_capacity = 0;
      if (peVar2 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2);
      }
      if ((element_type *)aStack_70._M_allocated_capacity != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_70._M_allocated_capacity);
      }
      peVar2 = child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      token.val.field_2._8_8_ = pSStack_58;
      if (child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->m_text)._M_dataplus._M_p =
               *(int *)&((child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_text)._M_dataplus._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&((child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->m_text)._M_dataplus._M_p =
               *(int *)&((child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_text)._M_dataplus._M_p + 1;
        }
      }
      SimpleASTNode::addChild(pSStack_40,(Ptr *)((long)&token.val.field_2 + 8));
      if (peVar2 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2);
      }
      if (CONCAT44(uStack_9c,local_a0) == 0) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar3,"\"||\" Light argument is required!");
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      local_110.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_text)._M_dataplus._M_p =
               *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_text)._M_dataplus._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_text)._M_dataplus._M_p =
               *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_text)._M_dataplus._M_p + 1;
        }
      }
      SimpleASTNode::addChild(pSStack_40,&local_110);
      if ((element_type *)
          local_110.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_110.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pSStack_58 = pSStack_40;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child1_1,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child1);
      if (child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if ((size_type *)token._0_8_ != &token.val._M_string_length) {
      operator_delete((void *)token._0_8_);
    }
    if (bVar6 || bVar5) {
      if (child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      *(SimpleASTNode **)tokens = pSStack_40;
      *(element_type **)(tokens + 8) =
           child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_text)._M_dataplus._M_p =
               *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_text)._M_dataplus._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_text)._M_dataplus._M_p =
               *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_text)._M_dataplus._M_p + 1;
        }
      }
      TokenReader::peek();
      _Var4._M_pi = extraout_RDX;
      if ((*(long *)tokens != 0) && (local_e0 == 3)) {
        TokenReader::read();
        local_e0 = local_a0;
        std::__cxx11::string::operator=((string *)&token,(string *)&child2);
        if (child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_88) {
          operator_delete(child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        }
        express((TokenReader *)&local_a0);
        local_88._16_4_ = 3;
        pSStack_58 = (SimpleASTNode *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<SimpleASTNode,std::allocator<SimpleASTNode>,ASTNodeType_const&,std::__cxx11::string_const&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child1_1,&pSStack_58,
                   (allocator<SimpleASTNode> *)((long)&token.val.field_2 + 8),
                   (ASTNodeType *)(local_88 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token);
        peVar2 = child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pSVar1 = pSStack_58;
        pSStack_58 = (SimpleASTNode *)0x0;
        child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        *(SimpleASTNode **)tokens = pSVar1;
        this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(tokens + 8);
        *(element_type **)(tokens + 8) = peVar2;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        if (child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     child1_1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        local_100.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pSStack_40;
        local_100.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->m_text)._M_dataplus._M_p =
                 *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_text)._M_dataplus._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->m_text)._M_dataplus._M_p =
                 *(int *)&((child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_text)._M_dataplus._M_p + 1;
          }
        }
        SimpleASTNode::addChild(pSVar1,&local_100);
        if ((element_type *)
            local_100.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_100.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (CONCAT44(uStack_9c,local_a0) == 0) {
          piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar3,"An valid expression is required!");
          __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pSVar1 = *(SimpleASTNode **)tokens;
        local_f0.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->m_text)._M_dataplus._M_p =
                 *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_text)._M_dataplus._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->m_text)._M_dataplus._M_p =
                 *(int *)&((child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_text)._M_dataplus._M_p + 1;
          }
        }
        SimpleASTNode::addChild(pSVar1,&local_f0);
        _Var4._M_pi = extraout_RDX_00;
        if ((element_type *)
            local_f0.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f0.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          _Var4._M_pi = extraout_RDX_01;
        }
        if (child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          _Var4._M_pi = extraout_RDX_02;
        }
      }
      if ((size_type *)token._0_8_ != &token.val._M_string_length) {
        operator_delete((void *)token._0_8_);
        _Var4._M_pi = extraout_RDX_03;
      }
      if (child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        _Var4._M_pi = extraout_RDX_04;
      }
      PVar7.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var4._M_pi;
      PVar7.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tokens;
      return (Ptr)PVar7.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

static SimpleASTNode::Ptr express(TokenReader& tokens)
{
    //std::cout << "in express" << std::endl;
    SimpleASTNode::Ptr child1 = orExpress(tokens);
    SimpleASTNode::Ptr node = child1;
    Token token = tokens.peek();
    if (node != nullptr && !token.isEmpty()) {
        if (token.type == TokenType::ASSIGN_TYPE) {
            token = tokens.read(); //consume "="
            SimpleASTNode::Ptr child2 = express(tokens);
            node = SimpleASTNode::create(ASTNodeType::ASSIGMENT, token.val);
            node->addChild(child1);
            if (child2 != nullptr)
                node->addChild(child2);
            else
                throw std::invalid_argument("An valid expression is required!");
        }
    }
    return node;
}